

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem-test.cc
# Opt level: O3

void __thiscall
ProblemTest_InvalidCommonExprIndex_Test::~ProblemTest_InvalidCommonExprIndex_Test
          (ProblemTest_InvalidCommonExprIndex_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ProblemTest, InvalidCommonExprIndex) {
  Problem p;
  const int num_exprs = 3;
  for (int i = 0; i < num_exprs; ++i)
    p.AddCommonExpr(mp::NumericExpr());
  EXPECT_ASSERT(p.common_expr(-1), "invalid index");
  EXPECT_ASSERT(p.common_expr(num_exprs), "invalid index");
}